

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

bool __thiscall
soplex::SPxFastRT<double>::maxReEnter
          (SPxFastRT<double> *this,double *sel,double maxabs,SPxId *id,int nr,bool polish)

{
  bool bVar1;
  UpdateVector<double> *pUVar2;
  double *pdVar3;
  SPxId *in_RDX;
  double *in_RSI;
  long in_RDI;
  byte in_R8B;
  double in_XMM0_Qa;
  double dVar4;
  VectorBase<double> *lcb;
  VectorBase<double> *ucb;
  SSVectorBase<double> *cupd;
  UpdateVector<double> *cvec;
  VectorBase<double> *lpb;
  VectorBase<double> *upb;
  SSVectorBase<double> *pupd;
  UpdateVector<double> *pvec;
  VectorBase<double> *low;
  VectorBase<double> *up;
  double d;
  double x;
  int in_stack_ffffffffffffff0c;
  SPxSolverBase<double> *in_stack_ffffffffffffff10;
  VectorBase<double> *in_stack_ffffffffffffff38;
  SVectorBase<double> *in_stack_ffffffffffffff40;
  double local_40;
  VectorBase<double> *local_38;
  
  SPxSolverBase<double>::pVec(*(SPxSolverBase<double> **)(in_RDI + 8));
  pUVar2 = SPxSolverBase<double>::pVec(*(SPxSolverBase<double> **)(in_RDI + 8));
  UpdateVector<double>::delta(pUVar2);
  SPxSolverBase<double>::upBound(*(SPxSolverBase<double> **)(in_RDI + 8));
  SPxSolverBase<double>::lpBound(*(SPxSolverBase<double> **)(in_RDI + 8));
  SPxSolverBase<double>::coPvec(*(SPxSolverBase<double> **)(in_RDI + 8));
  pUVar2 = SPxSolverBase<double>::coPvec(*(SPxSolverBase<double> **)(in_RDI + 8));
  UpdateVector<double>::delta(pUVar2);
  SPxSolverBase<double>::ucBound(*(SPxSolverBase<double> **)(in_RDI + 8));
  SPxSolverBase<double>::lcBound(*(SPxSolverBase<double> **)(in_RDI + 8));
  bVar1 = SPxSolverBase<double>::isCoId(*(SPxSolverBase<double> **)(in_RDI + 8),in_RDX);
  if (bVar1) {
    bVar1 = SPxSolverBase<double>::isCoBasic(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    if (bVar1) {
      SSVectorBase<double>::clearIdx
                ((SSVectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      return true;
    }
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    local_38 = (VectorBase<double> *)*pdVar3;
    local_40 = SSVectorBase<double>::operator[]
                         ((SSVectorBase<double> *)in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff0c);
    if (0.0 <= local_40) {
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
      ;
      dVar4 = *pdVar3;
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
      ;
      *in_RSI = (dVar4 - *pdVar3) / local_40;
    }
    else {
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
      ;
      dVar4 = *pdVar3;
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
      ;
      *in_RSI = (dVar4 - *pdVar3) / local_40;
    }
  }
  else {
    bVar1 = SPxSolverBase<double>::isId(*(SPxSolverBase<double> **)(in_RDI + 8),in_RDX);
    if (!bVar1) {
      return true;
    }
    SPxSolverBase<double>::vector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    dVar4 = SVectorBase<double>::operator*(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    *pdVar3 = dVar4;
    bVar1 = SPxSolverBase<double>::isBasic(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    if (bVar1) {
      SSVectorBase<double>::clearIdx
                ((SSVectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      return true;
    }
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    local_38 = (VectorBase<double> *)*pdVar3;
    local_40 = SSVectorBase<double>::operator[]
                         ((SSVectorBase<double> *)in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff0c);
    if (0.0 <= local_40) {
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
      ;
      dVar4 = *pdVar3;
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
      ;
      *in_RSI = (dVar4 - *pdVar3) / local_40;
    }
    else {
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
      ;
      dVar4 = *pdVar3;
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
      ;
      *in_RSI = (dVar4 - *pdVar3) / local_40;
    }
  }
  pdVar3 = VectorBase<double>::operator[]
                     ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  dVar4 = *pdVar3;
  pdVar3 = VectorBase<double>::operator[]
                     ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if ((dVar4 != *pdVar3) || (NAN(dVar4) || NAN(*pdVar3))) {
    if ((*in_RSI < -*(double *)(in_RDI + 0x48) / in_XMM0_Qa) && (*in_RSI = 0.0, (in_R8B & 1) == 0))
    {
      if (local_40 <= 0.0) {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff0c);
        *(double *)(*(long *)(in_RDI + 8) + 0x380) =
             *pdVar3 + *(double *)(*(long *)(in_RDI + 8) + 0x380);
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff0c);
        *pdVar3 = (double)local_38;
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff0c);
        *(double *)(*(long *)(in_RDI + 8) + 0x380) =
             *(double *)(*(long *)(in_RDI + 8) + 0x380) - *pdVar3;
      }
      else {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff0c);
        *(double *)(*(long *)(in_RDI + 8) + 0x380) =
             *(double *)(*(long *)(in_RDI + 8) + 0x380) - *pdVar3;
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff0c);
        *pdVar3 = (double)local_38;
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff0c);
        *(double *)(*(long *)(in_RDI + 8) + 0x380) =
             *pdVar3 + *(double *)(*(long *)(in_RDI + 8) + 0x380);
      }
    }
  }
  else {
    *in_RSI = 0.0;
    if ((in_R8B & 1) == 0) {
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
      ;
      if ((double)local_38 < *pdVar3 || (double)local_38 == *pdVar3) {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff0c);
        *(double *)(*(long *)(in_RDI + 8) + 0x380) =
             (*pdVar3 - (double)local_38) + *(double *)(*(long *)(in_RDI + 8) + 0x380);
      }
      else {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff0c);
        *(double *)(*(long *)(in_RDI + 8) + 0x380) =
             ((double)local_38 - *pdVar3) + *(double *)(*(long *)(in_RDI + 8) + 0x380);
      }
      pdVar3 = VectorBase<double>::operator[](local_38,in_stack_ffffffffffffff0c);
      *pdVar3 = (double)local_38;
      pdVar3 = VectorBase<double>::operator[](local_38,in_stack_ffffffffffffff0c);
      *pdVar3 = (double)local_38;
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::maxReEnter(R& sel,
                              R maxabs,
                              const SPxId& id,
                              int nr,
                              bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d < 0.0)
         sel = (lcb[nr] - cvec[nr]) / d;
      else
         sel = (ucb[nr] - cvec[nr]) / d;
   }
   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d < 0.0)
         sel = (lpb[nr] - pvec[nr]) / d;
      else
         sel = (upb[nr] - pvec[nr]) / d;
   }
   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel < -fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d > 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}